

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * testing::internal::XmlUnitTestResultPrinter::EscapeXml
                   (string *__return_storage_ptr__,string *str,bool is_attribute)

{
  ostream *poVar1;
  byte bVar2;
  string *psVar3;
  stringstream *psVar4;
  uchar value;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  uint uVar8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  string *local_60;
  string local_58;
  stringstream *local_38;
  
  local_60 = __return_storage_ptr__;
  Message::Message((Message *)&local_68);
  local_38 = local_68.ptr_;
  if (str->_M_string_length != 0) {
    poVar1 = (ostream *)(local_68.ptr_ + 0x10);
    uVar6 = 0;
    do {
      bVar2 = (str->_M_dataplus)._M_p[uVar6];
      uVar8 = (uint)bVar2;
      if (bVar2 < 0x27) {
        if (bVar2 == 0x22) {
          lVar5 = 6;
          pcVar7 = "&quot;";
          if (is_attribute) goto LAB_0013c79f;
          local_58._M_dataplus._M_p._0_1_ = 0x22;
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_58,1);
        }
        else {
          if (bVar2 == 0x26) {
            lVar5 = 5;
            pcVar7 = "&amp;";
            goto LAB_0013c79f;
          }
LAB_0013c7ba:
          if (('\x1f' < (char)bVar2) || ((uVar8 < 0xe && ((0x2600U >> (uVar8 & 0x1f) & 1) != 0)))) {
            if ((is_attribute) && ((uVar8 < 0xe && ((0x2600U >> (uVar8 & 0x1f) & 1) != 0)))) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"&#x",3);
              String::FormatByte_abi_cxx11_(&local_58,(String *)(ulong)uVar8,value);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar1,(char *)CONCAT71(local_58._M_dataplus._M_p._1_7_,
                                                 (byte)local_58._M_dataplus._M_p),
                         local_58._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,";",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_58._M_dataplus._M_p._1_7_,(byte)local_58._M_dataplus._M_p) !=
                  &local_58.field_2) {
                operator_delete((undefined1 *)
                                CONCAT71(local_58._M_dataplus._M_p._1_7_,
                                         (byte)local_58._M_dataplus._M_p),
                                local_58.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              local_58._M_dataplus._M_p._0_1_ = bVar2;
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_58,1);
            }
          }
        }
      }
      else {
        if (bVar2 == 0x27) {
          lVar5 = 6;
          pcVar7 = "&apos;";
          if (!is_attribute) {
            local_58._M_dataplus._M_p._0_1_ = 0x27;
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_58,1);
            goto LAB_0013c7a7;
          }
        }
        else {
          lVar5 = 4;
          if (uVar8 == 0x3e) {
            pcVar7 = "&gt;";
          }
          else {
            if (uVar8 != 0x3c) goto LAB_0013c7ba;
            pcVar7 = "&lt;";
          }
        }
LAB_0013c79f:
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar7,lVar5);
      }
LAB_0013c7a7:
      uVar6 = uVar6 + 1;
    } while (uVar6 < str->_M_string_length);
  }
  psVar4 = local_38;
  psVar3 = local_60;
  StringStreamToString(local_60,local_38);
  if (psVar4 != (stringstream *)0x0) {
    (**(code **)(*(long *)psVar4 + 8))(psVar4);
  }
  return psVar3;
}

Assistant:

std::string XmlUnitTestResultPrinter::EscapeXml(
    const std::string& str, bool is_attribute) {
  Message m;

  for (size_t i = 0; i < str.size(); ++i) {
    const char ch = str[i];
    switch (ch) {
      case '<':
        m << "&lt;";
        break;
      case '>':
        m << "&gt;";
        break;
      case '&':
        m << "&amp;";
        break;
      case '\'':
        if (is_attribute)
          m << "&apos;";
        else
          m << '\'';
        break;
      case '"':
        if (is_attribute)
          m << "&quot;";
        else
          m << '"';
        break;
      default:
        if (IsValidXmlCharacter(ch)) {
          if (is_attribute && IsNormalizableWhitespace(ch))
            m << "&#x" << String::FormatByte(static_cast<unsigned char>(ch))
              << ";";
          else
            m << ch;
        }
        break;
    }
  }

  return m.GetString();
}